

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p256_test.cc
# Opt level: O0

void __thiscall P256Test_AdxSquareABI_Test::TestBody(P256Test_AdxSquareABI_Test *this)

{
  int iVar1;
  Message *message;
  AssertHelper local_58 [3];
  Message local_40;
  unsigned_long local_38;
  uint64_t out [4];
  P256Test_AdxSquareABI_Test *this_local;
  
  iVar1 = CRYPTO_is_BMI1_capable();
  if (((iVar1 != 0) && (iVar1 = CRYPTO_is_BMI2_capable(), iVar1 != 0)) &&
     (iVar1 = CRYPTO_is_ADX_capable(), iVar1 != 0)) {
    abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*>
              ("fiat_p256_adx_sqr, out, in",
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/p256_test.cc"
               ,0x2a,true,fiat_p256_adx_sqr,&local_38,TestBody::in);
    return;
  }
  testing::Message::Message(&local_40);
  message = testing::Message::operator<<
                      (&local_40,(char (*) [39])"Can\'t test ABI of ADX code without ADX");
  testing::internal::AssertHelper::AssertHelper
            (local_58,kSkip,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/p256_test.cc"
             ,0x2c,"");
  testing::internal::AssertHelper::operator=(local_58,message);
  testing::internal::AssertHelper::~AssertHelper(local_58);
  testing::Message::~Message(&local_40);
  return;
}

Assistant:

TEST(P256Test, AdxSquareABI) {
  static const uint64_t in[4] = {0};
  uint64_t out[4];
  if (CRYPTO_is_BMI1_capable() && CRYPTO_is_BMI2_capable() &&
      CRYPTO_is_ADX_capable()) {
    CHECK_ABI(fiat_p256_adx_sqr, out, in);
  } else {
    GTEST_SKIP() << "Can't test ABI of ADX code without ADX";
  }
}